

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall
cmake::AddExtraGenerator(cmake *this,string *name,CreateExtraGeneratorFunctionType newFunction)

{
  cmExternalMakefileProjectGenerator *pcVar1;
  mapped_type *pp_Var2;
  pointer globalGenerator;
  string fullName;
  string local_50;
  
  pcVar1 = (*newFunction)();
  for (globalGenerator =
            (pcVar1->SupportedGlobalGenerators).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      globalGenerator !=
      (pcVar1->SupportedGlobalGenerators).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish; globalGenerator = globalGenerator + 1) {
    cmExternalMakefileProjectGenerator::CreateFullGeneratorName(&local_50,globalGenerator,name);
    pp_Var2 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)(),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExternalMakefileProjectGenerator_*(*)()>_>_>
              ::operator[](&this->ExtraGenerators,&local_50);
    *pp_Var2 = newFunction;
    std::__cxx11::string::~string((string *)&local_50);
  }
  (*pcVar1->_vptr_cmExternalMakefileProjectGenerator[1])(pcVar1);
  return;
}

Assistant:

void cmake::AddExtraGenerator(const std::string& name,
                              CreateExtraGeneratorFunctionType newFunction)
{
  cmExternalMakefileProjectGenerator* extraGenerator = newFunction();
  const std::vector<std::string>& supportedGlobalGenerators =
                                extraGenerator->GetSupportedGlobalGenerators();

  for(std::vector<std::string>::const_iterator
      it = supportedGlobalGenerators.begin();
      it != supportedGlobalGenerators.end();
      ++it )
    {
    std::string fullName = cmExternalMakefileProjectGenerator::
                                    CreateFullGeneratorName(*it, name);
    this->ExtraGenerators[fullName] = newFunction;
    }
  delete extraGenerator;
}